

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O1

void duckdb::SchemaDiscovery
               (ClientContext *context,ReadCSVData *result,CSVReaderOptions *options,
               MultiFileOptions *file_options,vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,MultiFileList *multi_file_list)

{
  CSVSchema *this;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *__ht;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pLVar2;
  ClientContext *pCVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined8 uVar6;
  bool bVar7;
  CSVStateMachineCache *pCVar8;
  idx_t iVar9;
  const_reference __args_2;
  CSVBufferManager *pCVar10;
  CSVBufferHandle *pCVar11;
  _Hash_node_base *p_Var12;
  idx_t iVar13;
  ulong uVar14;
  _Hash_node_base *p_Var15;
  pointer pcVar16;
  pointer pCVar17;
  CSVBufferManager *__tmp;
  _Hash_node_base *__n;
  LogicalType *type;
  pointer pLVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  idx_t rows_read;
  vector<duckdb::CSVSchema,_true> schemas;
  SnifferResult sniffer_result_1;
  vector<duckdb::OpenFileInfo,_true> file_paths;
  idx_t rows_read_1;
  CSVSchema best_schema;
  SnifferResult sniffer_result;
  CSVReaderOptions option_og;
  shared_ptr<duckdb::CSVBufferManager,_true> local_be8;
  undefined1 local_bd8 [32];
  undefined1 local_bb8 [32];
  element_type *local_b98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b90;
  CSVReaderOptions *local_b88;
  MultiFileOptions *local_b80;
  undefined1 local_b78 [56];
  undefined1 local_b40 [40];
  shared_ptr<duckdb::CSVBufferManager,_true> local_b18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b08;
  __node_base local_b00;
  ulong local_af8;
  unsigned_long local_af0;
  undefined1 local_ae8 [72];
  __node_base _Stack_aa0;
  _Alloc_hider local_a98;
  _Alloc_hider local_a90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a88;
  undefined4 local_a78;
  undefined4 uStack_a74;
  bool local_a70;
  idx_t local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [13];
  undefined1 local_6d8 [672];
  CSVReaderOptions local_438;
  
  local_bb8._0_8_ = (pointer)0x0;
  local_bb8._8_8_ = (pointer)0x0;
  local_bb8._16_8_ = 0;
  local_bd8._16_8_ = context;
  local_b98 = (element_type *)return_types;
  local_b80 = file_options;
  CSVReaderOptions::CSVReaderOptions(&local_438,options);
  (*multi_file_list->_vptr_MultiFileList[4])(local_b40);
  iVar13 = options->sample_size_chunks;
  vector<duckdb::OpenFileInfo,_true>::operator[]((vector<duckdb::OpenFileInfo,_true> *)local_b40,0);
  ::std::__cxx11::string::_M_assign((string *)&options->file_path);
  local_b78._0_8_ = local_b78._0_8_ & 0xffffffffffffff00;
  local_ae8._0_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVBufferManager,std::allocator<duckdb::CSVBufferManager>,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ae8 + 8),
             (CSVBufferManager **)local_ae8,(allocator<duckdb::CSVBufferManager> *)local_6d8,
             (ClientContext *)local_bd8._16_8_,options,&options->file_path,(bool *)local_b78);
  uVar4 = local_ae8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_ae8._8_8_ + 8) = *(_Atomic_word *)(local_ae8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_ae8._8_8_ + 8) = *(_Atomic_word *)(local_ae8._8_8_ + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_);
  }
  (result->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  p_Var1 = (result->buffer_manager).internal.
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (result->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  local_b18.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (result->buffer_manager).internal.
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b18.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (result->buffer_manager).internal.
       super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_b18.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b18.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_b18.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b18.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_b18.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  pCVar8 = CSVStateMachineCache::Get((ClientContext *)local_bd8._16_8_);
  CSVSniffer::CSVSniffer((CSVSniffer *)local_ae8,options,local_b80,&local_b18,pCVar8,true);
  if (local_b18.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b18.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  CSVSniffer::SniffCSV((SnifferResult *)local_6d8,(CSVSniffer *)local_ae8,false);
  iVar9 = CSVSniffer::LinesSniffed((CSVSniffer *)local_ae8);
  local_be8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (iVar9 - ((ulong)(options->dialect_options).header.value +
                  (options->dialect_options).skip_rows.value));
  __args_2 = vector<duckdb::OpenFileInfo,_true>::operator[]
                       ((vector<duckdb::OpenFileInfo,_true> *)local_b40,0);
  pCVar10 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&result->buffer_manager);
  CSVBufferManager::GetBuffer((CSVBufferManager *)local_b78,(idx_t)pCVar10);
  pCVar11 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                      ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_b78);
  local_bd8[0] = pCVar11->actual_size == 0;
  ::std::vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>>::
  emplace_back<duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,std::__cxx11::string_const&,unsigned_long&,bool>
            ((vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>> *)local_bb8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(local_6d8 + 0x18),(vector<duckdb::LogicalType,_true> *)local_6d8,&__args_2->path,
             (unsigned_long *)&local_be8,(bool *)local_bd8);
  if ((ClientContext *)local_b78._8_8_ != (ClientContext *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b78._8_8_);
  }
  iVar9 = CSVSniffer::LinesSniffed((CSVSniffer *)local_ae8);
  bVar7 = CSVSniffer::EmptyOrOnlyHeader((CSVSniffer *)local_ae8);
  uVar14 = iVar13 << 0xb;
  p_Var15 = (_Hash_node_base *)(ulong)bVar7;
  local_b90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)names;
  local_b88 = options;
  local_b08._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_6d8 + 0x18));
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_6d8);
  CSVSniffer::~CSVSniffer((CSVSniffer *)local_ae8);
  p_Var12 = (_Hash_node_base *)
            (((long)(local_b40._8_8_ - local_b40._0_8_) >> 4) * -0x5555555555555555);
  local_b00._M_nxt = (_Hash_node_base *)0xa;
  if (p_Var12 < (_Hash_node_base *)0xa) {
    local_b00._M_nxt = p_Var12;
  }
  __n = (_Hash_node_base *)&DAT_00000001;
  local_af8 = uVar14;
  if ((iVar9 < uVar14) && ((_Hash_node_base *)&DAT_00000001 < p_Var12)) {
    do {
      CSVReaderOptions::CSVReaderOptions((CSVReaderOptions *)local_ae8,&local_438);
      vector<duckdb::OpenFileInfo,_true>::operator[]
                ((vector<duckdb::OpenFileInfo,_true> *)local_b40,(size_type)__n);
      ::std::__cxx11::string::_M_assign((string *)local_878);
      local_bd8[0] = false;
      local_6d8._0_8_ = (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::CSVBufferManager,std::allocator<duckdb::CSVBufferManager>,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,bool>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d8 + 8),
                 (CSVBufferManager **)local_6d8,(allocator<duckdb::CSVBufferManager> *)local_b78,
                 (ClientContext *)local_bd8._16_8_,(CSVReaderOptions *)local_ae8,local_878,
                 (bool *)local_bd8);
      local_be8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_6d8._0_8_;
      local_be8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._8_8_;
      if ((element_type *)local_6d8._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_6d8._8_8_ + 8) = *(int *)(local_6d8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_6d8._8_8_ + 8) = *(int *)(local_6d8._8_8_ + 8) + 1;
        }
      }
      if ((element_type *)local_6d8._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._8_8_);
      }
      local_b40._24_8_ =
           local_be8.internal.
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b40._32_8_ =
           local_be8.internal.
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if ((element_type *)
          local_be8.internal.
          super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_be8.internal.
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_be8.internal.
                super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_be8.internal.
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_be8.internal.
                super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      pCVar8 = CSVStateMachineCache::Get((ClientContext *)local_bd8._16_8_);
      CSVSniffer::CSVSniffer
                ((CSVSniffer *)local_6d8,(CSVReaderOptions *)local_ae8,local_b80,
                 (shared_ptr<duckdb::CSVBufferManager,_true> *)(local_b40 + 0x18),pCVar8,true);
      if ((element_type *)local_b40._32_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b40._32_8_);
      }
      CSVSniffer::SniffCSV((SnifferResult *)local_b78,(CSVSniffer *)local_6d8,false);
      iVar13 = CSVSniffer::LinesSniffed((CSVSniffer *)local_6d8);
      local_af0 = iVar13 - (((ulong)local_ae8._64_8_ >> 8 & 0xff) + local_a68);
      pCVar10 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&local_be8);
      CSVBufferManager::GetBuffer((CSVBufferManager *)local_bd8,(idx_t)pCVar10);
      pCVar11 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                          ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_bd8);
      iVar13 = pCVar11->actual_size;
      if ((ClientContext *)local_bd8._8_8_ != (ClientContext *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_bd8._8_8_);
      }
      if (iVar13 == 0) {
        local_bd8[0] = true;
        ::std::vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>::emplace_back<bool>
                  ((vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_> *)local_bb8,
                   (bool *)local_bd8);
      }
      else {
        ::std::vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>>::
        emplace_back<duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,std::__cxx11::string&,unsigned_long&>
                  ((vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>> *)local_bb8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)(local_b78 + 0x18),(vector<duckdb::LogicalType,_true> *)local_b78,local_878,
                   &local_af0);
      }
      iVar13 = CSVSniffer::LinesSniffed((CSVSniffer *)local_6d8);
      bVar7 = CSVSniffer::EmptyOrOnlyHeader((CSVSniffer *)local_6d8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_b78 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_b78);
      CSVSniffer::~CSVSniffer((CSVSniffer *)local_6d8);
      if ((element_type *)
          local_be8.internal.
          super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_be8.internal.
                   super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar9 = iVar9 + iVar13;
      p_Var15 = (_Hash_node_base *)((long)&p_Var15->_M_nxt + (ulong)bVar7);
      __n = (_Hash_node_base *)((long)&__n->_M_nxt + 1);
      CSVReaderOptions::~CSVReaderOptions((CSVReaderOptions *)local_ae8);
    } while ((iVar9 < local_af8) && (__n < local_b00._M_nxt));
  }
  uVar4 = local_bb8._8_8_;
  __ht = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)(local_ae8 + 0x18);
  local_ae8._0_8_ = (CSVBufferManager *)0x0;
  local_ae8._8_8_ = (pointer)0x0;
  local_ae8._16_8_ = 0;
  local_ae8._24_8_ = &_Stack_aa0;
  local_ae8._32_8_ = 1;
  local_ae8._40_8_ = (__pthread_internal_list *)0x0;
  local_ae8._48_8_ = 0;
  local_ae8._56_4_ = 0x3f800000;
  local_ae8._64_8_ = 0;
  _Stack_aa0._M_nxt = (_Hash_node_base *)0x0;
  local_a98._M_p = (pointer)&local_a88;
  local_a90._M_p = (pointer)0x0;
  local_a88._M_local_buf[0] = '\0';
  _local_a78 = 0;
  local_a70 = false;
  if (local_bb8._0_8_ != local_bb8._8_8_) {
    pcVar16 = (pointer)(local_bb8._0_8_ + 0x50);
    do {
      bVar7 = CSVSchema::Empty((CSVSchema *)local_ae8);
      this = (CSVSchema *)(pcVar16 + -0x50);
      if (bVar7) {
        ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::operator=
                  ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)
                   local_ae8,
                   (vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)this);
LAB_0154070b:
        if (this != (CSVSchema *)local_ae8) {
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)__ht,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)(pcVar16 + -0x38));
        }
        ::std::__cxx11::string::_M_assign((string *)&local_a98);
        local_a70 = (bool)pcVar16[0x28];
        _local_a78 = *(undefined8 *)(pcVar16 + 0x20);
      }
      else {
        iVar13 = CSVSchema::GetRowsRead((CSVSchema *)local_ae8);
        if (iVar13 == 0) {
          ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::operator=
                    ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)
                     local_ae8,
                     (vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)this);
          goto LAB_0154070b;
        }
        iVar13 = CSVSchema::GetRowsRead(this);
        if (iVar13 != 0) {
          CSVSchema::MergeSchemas((CSVSchema *)local_ae8,this,local_b88->null_padding);
        }
      }
      pCVar17 = (pointer)(pcVar16 + 0x30);
      pcVar16 = pcVar16 + 0x80;
    } while (pCVar17 != (pointer)uVar4);
  }
  if ((((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(local_b90._M_pi)->_vptr__Sp_counted_base)->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start == *(pointer *)&(local_b90._M_pi)->_M_use_count) {
    CSVSchema::GetNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_b78,(CSVSchema *)local_ae8);
    local_6d8._0_8_ =
         (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(local_b90._M_pi)->_vptr__Sp_counted_base)->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_6d8._8_8_ = *(undefined8 *)&(local_b90._M_pi)->_M_use_count;
    local_6d8._16_8_ = local_b90._M_pi[1]._vptr__Sp_counted_base;
    (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&(local_b90._M_pi)->_vptr__Sp_counted_base)->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_b78._0_8_;
    *(undefined8 *)&(local_b90._M_pi)->_M_use_count = local_b78._8_8_;
    local_b90._M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_b78._16_8_;
    local_b78._0_8_ =
         (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)0x0;
    local_b78._8_8_ = (ClientContext *)0x0;
    local_b78._16_8_ = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6d8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b78);
    CSVSchema::GetTypes((vector<duckdb::LogicalType,_true> *)local_b78,(CSVSchema *)local_ae8);
    local_6d8._0_8_ =
         (((_Vector_impl *)&(local_b98->options)._M_h._M_buckets)->super__Vector_impl_data)._M_start
    ;
    local_6d8._8_8_ = (local_b98->options)._M_h._M_bucket_count;
    local_6d8._16_8_ = (local_b98->options)._M_h._M_before_begin._M_nxt;
    (((_Vector_impl *)&(local_b98->options)._M_h._M_buckets)->super__Vector_impl_data)._M_start =
         (pointer)local_b78._0_8_;
    (local_b98->options)._M_h._M_bucket_count = local_b78._8_8_;
    (local_b98->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_b78._16_8_;
    local_b78._0_8_ = (_Head_base<0UL,_duckdb::CSVFileHandle_*,_false>)0x0;
    local_b78._8_8_ = (ClientContext *)0x0;
    local_b78._16_8_ = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_6d8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_b78);
  }
  _Var5._M_pi = local_b08._M_pi;
  if ((p_Var15 == __n) && (local_b88->columns_set == false)) {
    pLVar18 = (((_Vector_impl *)&(local_b98->options)._M_h._M_buckets)->super__Vector_impl_data).
              _M_start;
    pLVar2 = (pointer)(local_b98->options)._M_h._M_bucket_count;
    if (pLVar18 != pLVar2) {
      do {
        LogicalType::LogicalType((LogicalType *)local_6d8,VARCHAR);
        uVar6 = local_6d8._16_8_;
        uVar4 = local_6d8._8_8_;
        pLVar18->id_ = (LogicalTypeId)local_6d8[0];
        pLVar18->physical_type_ = local_6d8[1];
        uVar19 = *(undefined4 *)
                  &(pLVar18->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar20 = *(undefined4 *)
                  ((long)&(pLVar18->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pCVar3 = (ClientContext *)
                 (pLVar18->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar21 = *(undefined4 *)
                  &(pLVar18->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar22 = *(undefined4 *)
                  ((long)&(pLVar18->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pLVar18->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pLVar18->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_6d8._8_8_ = (pointer)0x0;
        local_6d8._16_8_ = (pointer)0x0;
        p_Var1 = (pLVar18->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pLVar18->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar4;
        (pLVar18->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_bd8._16_8_ = pCVar3;
          local_bd8._24_4_ = uVar21;
          local_bd8._28_4_ = uVar22;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          uVar19 = local_bd8._16_4_;
          uVar20 = local_bd8._20_4_;
          uVar21 = local_bd8._24_4_;
          uVar22 = local_bd8._28_4_;
        }
        uVar4 = local_6d8._16_8_;
        local_6d8._12_4_ = uVar20;
        local_6d8._8_4_ = uVar19;
        local_6d8._20_4_ = uVar22;
        local_6d8[0x10] = SUB41(uVar21,0);
        local_6d8[0x11] = SUB41(uVar21,1);
        local_6d8._18_2_ = SUB42(uVar21,2);
        if ((pointer)uVar4 != (pointer)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        }
        LogicalType::~LogicalType((LogicalType *)local_6d8);
        pLVar18 = pLVar18 + 1;
      } while (pLVar18 != pLVar2);
    }
  }
  ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::operator=
            ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)
             &_Var5._M_pi[0x48]._M_use_count,
             (vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)local_ae8);
  if ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)local_ae8 !=
      (vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)
      &_Var5._M_pi[0x48]._M_use_count) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)(_Var5._M_pi + 0x4a),__ht);
  }
  ::std::__cxx11::string::_M_assign((string *)&_Var5._M_pi[0x4d]._M_use_count);
  *(bool *)&_Var5._M_pi[0x50]._vptr__Sp_counted_base = local_a70;
  _Var5._M_pi[0x4f]._M_use_count = local_a78;
  _Var5._M_pi[0x4f]._M_weak_count = uStack_a74;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_p != &local_a88) {
    operator_delete(local_a98._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(__ht);
  ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::~vector
            ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)local_ae8);
  ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_b40);
  CSVReaderOptions::~CSVReaderOptions(&local_438);
  ::std::vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>::~vector
            ((vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_> *)local_bb8);
  return;
}

Assistant:

void SchemaDiscovery(ClientContext &context, ReadCSVData &result, CSVReaderOptions &options,
                     const MultiFileOptions &file_options, vector<LogicalType> &return_types, vector<string> &names,
                     MultiFileList &multi_file_list) {
	vector<CSVSchema> schemas;
	const auto option_og = options;

	const auto file_paths = multi_file_list.GetAllFiles();

	// Here what we want to do is to sniff a given number of lines, if we have many files, we might go through them
	// to reach the number of lines.
	const idx_t required_number_of_lines = options.sniff_size * options.sample_size_chunks;

	idx_t total_number_of_rows = 0;
	idx_t current_file = 0;
	options.file_path = file_paths[current_file].path;

	result.buffer_manager = make_shared_ptr<CSVBufferManager>(context, options, options.file_path, false);
	idx_t only_header_or_empty_files = 0;

	{
		CSVSniffer sniffer(options, file_options, result.buffer_manager, CSVStateMachineCache::Get(context));
		auto sniffer_result = sniffer.SniffCSV();
		idx_t rows_read = sniffer.LinesSniffed() -
		                  (options.dialect_options.skip_rows.GetValue() + options.dialect_options.header.GetValue());

		schemas.emplace_back(sniffer_result.names, sniffer_result.return_types, file_paths[0].path, rows_read,
		                     result.buffer_manager->GetBuffer(0)->actual_size == 0);
		total_number_of_rows += sniffer.LinesSniffed();
		current_file++;
		if (sniffer.EmptyOrOnlyHeader()) {
			only_header_or_empty_files++;
		}
	}

	// We do a copy of the options to not pollute the options of the first file.
	constexpr idx_t max_files_to_sniff = 10;
	idx_t files_to_sniff = file_paths.size() > max_files_to_sniff ? max_files_to_sniff : file_paths.size();
	while (total_number_of_rows < required_number_of_lines && current_file < files_to_sniff) {
		auto option_copy = option_og;
		option_copy.file_path = file_paths[current_file].path;
		auto buffer_manager = make_shared_ptr<CSVBufferManager>(context, option_copy, option_copy.file_path, false);
		// TODO: We could cache the sniffer to be reused during scanning. Currently that's an exercise left to the
		// reader
		CSVSniffer sniffer(option_copy, file_options, buffer_manager, CSVStateMachineCache::Get(context));
		auto sniffer_result = sniffer.SniffCSV();
		idx_t rows_read = sniffer.LinesSniffed() - (option_copy.dialect_options.skip_rows.GetValue() +
		                                            option_copy.dialect_options.header.GetValue());
		if (buffer_manager->GetBuffer(0)->actual_size == 0) {
			schemas.emplace_back(true);
		} else {
			schemas.emplace_back(sniffer_result.names, sniffer_result.return_types, option_copy.file_path, rows_read);
		}
		total_number_of_rows += sniffer.LinesSniffed();
		if (sniffer.EmptyOrOnlyHeader()) {
			only_header_or_empty_files++;
		}
		current_file++;
	}

	// We might now have multiple schemas, we need to go through them to define the one true schema
	CSVSchema best_schema;
	for (auto &schema : schemas) {
		if (best_schema.Empty()) {
			// A schema is bettah than no schema
			best_schema = schema;
		} else if (best_schema.GetRowsRead() == 0) {
			// If the best-schema has no data-rows, that's easy, we just take the new schema
			best_schema = schema;
		} else if (schema.GetRowsRead() != 0) {
			// We might have conflicting-schemas, we must merge them
			best_schema.MergeSchemas(schema, options.null_padding);
		}
	}

	if (names.empty()) {
		names = best_schema.GetNames();
		return_types = best_schema.GetTypes();
	}
	if (only_header_or_empty_files == current_file && !options.columns_set) {
		for (auto &type : return_types) {
			D_ASSERT(type.id() == LogicalTypeId::BOOLEAN);
			// we default to varchar if all files are empty or only have a header after all the sniffing
			type = LogicalType::VARCHAR;
		}
	}
	result.csv_schema = best_schema;
}